

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O3

int Kit_WordCountOnes_64bit(word x)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = x - (x >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
  uVar2 = (uVar2 >> 8) + uVar2;
  lVar1 = (uVar2 >> 0x10) + uVar2;
  return (int)((ulong)lVar1 >> 0x20) + (int)lVar1 & 0xff;
}

Assistant:

int Kit_WordCountOnes_64bit(word x)
{
    x = x - ((x >> 1) & ABC_CONST(0x5555555555555555));   
    x = (x & ABC_CONST(0x3333333333333333)) + ((x >> 2) & ABC_CONST(0x3333333333333333));    
    x = (x + (x >> 4)) & ABC_CONST(0x0F0F0F0F0F0F0F0F);    
    x = x + (x >> 8);
    x = x + (x >> 16);
    x = x + (x >> 32); 
    return (int)(x & 0xFF);
}